

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

void __thiscall
Saturation::SaturationAlgorithm::onClauseReduction
          (SaturationAlgorithm *this,Clause *cl,Clause **replacements,uint numOfReplacements,
          ClauseIterator *premises,bool forward)

{
  int *piVar1;
  Clause *pCVar2;
  Splitter *this_00;
  ostream *poVar3;
  Clause **ppCVar4;
  Clause *parent;
  char *pcVar5;
  SymElOutput *this_01;
  long lVar6;
  Clause **ppCVar7;
  string local_70;
  Clause *local_50;
  VirtualIterator<Kernel::Clause_*> local_48;
  Clause *local_40;
  ClauseIterator local_38;
  
  local_50 = cl;
  if (onClauseReduction(Kernel::Clause*,Kernel::Clause**,unsigned_int,Lib::VirtualIterator<Kernel::Clause*>,bool)
      ::premStack == '\0') {
    onClauseReduction();
  }
  onClauseReduction::premStack._cursor = onClauseReduction::premStack._stack;
  local_48._core = premises->_core;
  if (local_48._core != (IteratorCore<Kernel::Clause_*> *)0x0) {
    (local_48._core)->_refCnt = (local_48._core)->_refCnt + 1;
  }
  Lib::Stack<Kernel::Clause*>::loadFromIterator<Lib::VirtualIterator<Kernel::Clause*>>
            ((Stack<Kernel::Clause*> *)&onClauseReduction::premStack,&local_48);
  if (local_48._core != (IteratorCore<Kernel::Clause_*> *)0x0) {
    piVar1 = &(local_48._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_48._core)->_vptr_IteratorCore[1])();
    }
  }
  if (numOfReplacements == 0) {
    local_40 = (Clause *)0x0;
  }
  else {
    local_40 = *replacements;
  }
  if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa0fa) & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[SA] ",5);
    pcVar5 = "backward";
    if (forward) {
      pcVar5 = "forward";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar5,8 - (ulong)forward);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reduce: ",9);
    Kernel::Clause::toString_abi_cxx11_(&local_70,local_50);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (numOfReplacements != 0) {
      lVar6 = 0;
      do {
        pCVar2 = replacements[lVar6];
        if (pCVar2 != (Clause *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"      replaced by ",0x12);
          Kernel::Clause::toString_abi_cxx11_(&local_70,pCVar2);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_70._M_dataplus._M_p,
                              local_70._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        lVar6 = lVar6 + 1;
      } while (numOfReplacements != (uint)lVar6);
    }
    if (onClauseReduction::premStack._cursor != onClauseReduction::premStack._stack) {
      ppCVar4 = onClauseReduction::premStack._stack;
      ppCVar7 = onClauseReduction::premStack._cursor;
      do {
        pCVar2 = ppCVar7[-1];
        if (pCVar2 != (Clause *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"     using ",0xb);
          Kernel::Clause::toString_abi_cxx11_(&local_70,pCVar2);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_70._M_dataplus._M_p,
                              local_70._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          ppCVar4 = onClauseReduction::premStack._stack;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            ppCVar4 = onClauseReduction::premStack._stack;
          }
        }
        ppCVar7 = ppCVar7 + -1;
      } while (ppCVar7 != ppCVar4);
    }
  }
  pCVar2 = local_40;
  ppCVar4 = onClauseReduction::premStack._cursor;
  this_00 = this->_splitter;
  if (this_00 != (Splitter *)0x0) {
    local_38._core =
         (IteratorCore<Kernel::Clause_*> *)
         Lib::FixedSizeAllocator<32UL>::alloc
                   ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    (local_38._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b403c0;
    local_38._core[1]._vptr_IteratorCore = (_func_int **)ppCVar4;
    *(ClauseStack **)&local_38._core[1]._refCnt = &onClauseReduction::premStack;
    (local_38._core)->_refCnt = 1;
    Splitter::onClauseReduction(this_00,local_50,&local_38,pCVar2);
    if (local_38._core != (IteratorCore<Kernel::Clause_*> *)0x0) {
      piVar1 = &(local_38._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_38._core)->_vptr_IteratorCore[1])();
      }
    }
  }
  if (pCVar2 != (Clause *)0x0) {
    this_01 = this->_symEl;
    parent = local_50;
    if (this_01 == (SymElOutput *)0x0) goto LAB_00672230;
    do {
      SymElOutput::onParenthood(this_01,pCVar2,parent);
LAB_00672230:
      do {
        if (onClauseReduction::premStack._cursor == onClauseReduction::premStack._stack) {
          return;
        }
        onClauseReduction::premStack._cursor = onClauseReduction::premStack._cursor + -1;
        this_01 = this->_symEl;
      } while (this_01 == (SymElOutput *)0x0);
      parent = *onClauseReduction::premStack._cursor;
    } while( true );
  }
  return;
}

Assistant:

void SaturationAlgorithm::onClauseReduction(Clause* cl, Clause **replacements, unsigned numOfReplacements,
                                            ClauseIterator premises, bool forward)
{
  ASS(cl);

  static ClauseStack premStack;
  premStack.reset();
  premStack.loadFromIterator(premises);

  Clause *replacement = numOfReplacements ? *replacements : 0;

  if (env.options->showReductions()) {
    std::cout << "[SA] " << (forward ? "forward" : "backward") << " reduce: " << cl->toString() << endl;
    for(unsigned i = 0; i < numOfReplacements; i++){
      Clause* replacement = *replacements;
      if(replacement){ std::cout << "      replaced by " << replacement->toString() << endl; }
      replacements++;
    }
    ClauseStack::Iterator pit(premStack);
    while(pit.hasNext()){
      Clause* premise = pit.next();
      if(premise){ std::cout << "     using " << premise->toString() << endl; }
    }
  }

  if (_splitter) {
    _splitter->onClauseReduction(cl, pvi(ClauseStack::Iterator(premStack)), replacement);
  }

  if (replacement) {
    // Where an inference has multiple conclusions, onParenthood will only be run
    // for the final conclusion. This is unsafe when running with symbol elimination.
    // At the moment the only simplification rules that have multiple conclusions
    // are higher-order and it is assumed that we will not run higher-order along
    // with symbol elimination.
    // In the future if a first-order simplification rule is added with multiple
    // conclusions, this code should be updated.
    onParenthood(replacement, cl);
    while (premStack.isNonEmpty()) {
      onParenthood(replacement, premStack.pop());
    }
  }
}